

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomizer_options.cpp
# Opt level: O0

string * __thiscall
RandomizerOptions::permalink_abi_cxx11_(string *__return_storage_ptr__,RandomizerOptions *this)

{
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  const_reference pvVar4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *input;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_b8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_70;
  value_type_conflict local_52;
  uint8_t local_51;
  uint8_t quantity;
  ulong uStack_50;
  uint8_t item_id;
  size_t i;
  undefined1 local_38 [8];
  BitstreamWriter bitpack;
  RandomizerOptions *this_local;
  
  bitpack._24_8_ = this;
  BitstreamWriter::BitstreamWriter((BitstreamWriter *)local_38);
  BitstreamWriter::pack((BitstreamWriter *)local_38,'\x12');
  BitstreamWriter::pack((BitstreamWriter *)local_38,this->_goal);
  BitstreamWriter::pack((BitstreamWriter *)local_38,this->_jewel_count);
  BitstreamWriter::pack((BitstreamWriter *)local_38,this->_starting_life);
  BitstreamWriter::pack((BitstreamWriter *)local_38,this->_starting_gold);
  BitstreamWriter::pack((BitstreamWriter *)local_38,this->_health_gained_per_lifestock);
  BitstreamWriter::pack((BitstreamWriter *)local_38,(bool)(this->_fast_transitions & 1));
  BitstreamWriter::pack((BitstreamWriter *)local_38,this->_seed);
  BitstreamWriter::pack((BitstreamWriter *)local_38,(bool)(this->_use_armor_upgrades & 1));
  BitstreamWriter::pack((BitstreamWriter *)local_38,(bool)(this->_fix_armlet_skip & 1));
  BitstreamWriter::pack
            ((BitstreamWriter *)local_38,(bool)(this->_remove_tree_cutting_glitch_drops & 1));
  BitstreamWriter::pack((BitstreamWriter *)local_38,(bool)(this->_consumable_record_book & 1));
  BitstreamWriter::pack((BitstreamWriter *)local_38,(bool)(this->_consumable_spell_book & 1));
  BitstreamWriter::pack((BitstreamWriter *)local_38,(bool)(this->_remove_gumi_boulder & 1));
  BitstreamWriter::pack((BitstreamWriter *)local_38,(bool)(this->_remove_tibor_requirement & 1));
  BitstreamWriter::pack((BitstreamWriter *)local_38,(bool)(this->_all_trees_visited_at_start & 1));
  BitstreamWriter::pack((BitstreamWriter *)local_38,(bool)(this->_ekeeke_auto_revive & 1));
  BitstreamWriter::pack((BitstreamWriter *)local_38,(bool)(this->_allow_spoiler_log & 1));
  BitstreamWriter::pack((BitstreamWriter *)local_38,(bool)(this->_shuffle_tibor_trees & 1));
  BitstreamWriter::pack((BitstreamWriter *)local_38,(bool)(this->_enemy_jumping_in_logic & 1));
  BitstreamWriter::pack((BitstreamWriter *)local_38,(bool)(this->_tree_cutting_glitch_in_logic & 1))
  ;
  BitstreamWriter::pack((BitstreamWriter *)local_38,(bool)(this->_damage_boosting_in_logic & 1));
  BitstreamWriter::pack
            ((BitstreamWriter *)local_38,(bool)(this->_allow_whistle_usage_behind_trees & 1));
  BitstreamWriter::pack((BitstreamWriter *)local_38,(bool)(this->_ensure_ekeeke_in_shops & 1));
  BitstreamWriter::pack_array<unsigned_char,69ul>
            ((BitstreamWriter *)local_38,&this->_items_distribution);
  BitstreamWriter::pack((BitstreamWriter *)local_38,this->_filler_item);
  BitstreamWriter::pack((BitstreamWriter *)local_38,this->_hints_distribution_region_requirement);
  BitstreamWriter::pack((BitstreamWriter *)local_38,this->_hints_distribution_item_requirement);
  BitstreamWriter::pack((BitstreamWriter *)local_38,this->_hints_distribution_item_location);
  BitstreamWriter::pack((BitstreamWriter *)local_38,this->_hints_distribution_dark_region);
  BitstreamWriter::pack((BitstreamWriter *)local_38,this->_hints_distribution_joke);
  BitstreamWriter::pack((BitstreamWriter *)local_38,(bool)(this->_christmas_event & 1));
  BitstreamWriter::pack((BitstreamWriter *)local_38,(bool)(this->_secret_event & 1));
  BitstreamWriter::pack_if<unsigned_short>
            ((BitstreamWriter *)local_38,this->_enemies_damage_factor != 100,
             this->_enemies_damage_factor);
  BitstreamWriter::pack_if<unsigned_short>
            ((BitstreamWriter *)local_38,this->_enemies_health_factor != 100,
             this->_enemies_health_factor);
  BitstreamWriter::pack_if<unsigned_short>
            ((BitstreamWriter *)local_38,this->_enemies_armor_factor != 100,
             this->_enemies_armor_factor);
  BitstreamWriter::pack_if<unsigned_short>
            ((BitstreamWriter *)local_38,this->_enemies_golds_factor != 100,
             this->_enemies_golds_factor);
  BitstreamWriter::pack_if<unsigned_short>
            ((BitstreamWriter *)local_38,this->_enemies_drop_chance_factor != 100,
             this->_enemies_drop_chance_factor);
  BitstreamWriter::pack_if<unsigned_short>
            ((BitstreamWriter *)local_38,this->_shop_prices_factor != 100,this->_shop_prices_factor)
  ;
  uStack_50 = 0;
  while( true ) {
    uVar1 = uStack_50;
    sVar3 = std::array<unsigned_char,_62UL>::size(&this->_starting_items);
    if (sVar3 <= uVar1) break;
    local_51 = (uint8_t)uStack_50;
    pvVar4 = std::array<unsigned_char,_62UL>::operator[](&this->_starting_items,uStack_50);
    local_52 = *pvVar4;
    if (local_52 != '\0') {
      BitstreamWriter::pack((BitstreamWriter *)local_38,true);
      BitstreamWriter::pack((BitstreamWriter *)local_38,local_51);
      BitstreamWriter::pack((BitstreamWriter *)local_38,local_52);
    }
    uStack_50 = uStack_50 + 1;
  }
  BitstreamWriter::pack((BitstreamWriter *)local_38,false);
  BitstreamWriter::pack_vector<unsigned_char>
            ((BitstreamWriter *)local_38,&this->_possible_spawn_locations);
  BitstreamWriter::pack_vector<unsigned_char>
            ((BitstreamWriter *)local_38,&this->_finite_ground_items);
  BitstreamWriter::pack_vector<unsigned_char>((BitstreamWriter *)local_38,&this->_finite_shop_items)
  ;
  bVar2 = nlohmann::
          basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::empty(&this->_world_json);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::to_msgpack(&local_70,&this->_world_json);
  BitstreamWriter::pack_vector_if<unsigned_char>((BitstreamWriter *)local_38,!bVar2,&local_70);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_70);
  bVar2 = nlohmann::
          basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::empty(&this->_model_patch_items);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::to_msgpack(&local_88,&this->_model_patch_items);
  BitstreamWriter::pack_vector_if<unsigned_char>((BitstreamWriter *)local_38,!bVar2,&local_88);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_88);
  bVar2 = nlohmann::
          basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::empty(&this->_model_patch_spawns);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::to_msgpack(&local_a0,&this->_model_patch_spawns);
  BitstreamWriter::pack_vector_if<unsigned_char>((BitstreamWriter *)local_38,!bVar2,&local_a0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_a0);
  bVar2 = nlohmann::
          basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::empty(&this->_model_patch_hint_sources);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::to_msgpack(&local_b8,&this->_model_patch_hint_sources);
  BitstreamWriter::pack_vector_if<unsigned_char>((BitstreamWriter *)local_38,!bVar2,&local_b8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_b8);
  input = BitstreamWriter::bytes((BitstreamWriter *)local_38);
  base64_encode_abi_cxx11_(&local_f8,input);
  std::operator+(&local_d8,"l",&local_f8);
  std::operator+(__return_storage_ptr__,&local_d8,"s");
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  BitstreamWriter::~BitstreamWriter((BitstreamWriter *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string RandomizerOptions::permalink() const
{
    BitstreamWriter bitpack;

    bitpack.pack((uint8_t)MAJOR_RELEASE);

    bitpack.pack(_goal);
    bitpack.pack(_jewel_count);
    bitpack.pack(_starting_life);
    bitpack.pack(_starting_gold);
    bitpack.pack(_health_gained_per_lifestock);
    bitpack.pack(_fast_transitions);

    bitpack.pack(_seed);

    bitpack.pack(_use_armor_upgrades);
    bitpack.pack(_fix_armlet_skip);
    bitpack.pack(_remove_tree_cutting_glitch_drops);
    bitpack.pack(_consumable_record_book);
    bitpack.pack(_consumable_spell_book);
    bitpack.pack(_remove_gumi_boulder);
    bitpack.pack(_remove_tibor_requirement);
    bitpack.pack(_all_trees_visited_at_start);
    bitpack.pack(_ekeeke_auto_revive);
    bitpack.pack(_allow_spoiler_log);
    bitpack.pack(_shuffle_tibor_trees);
    bitpack.pack(_enemy_jumping_in_logic);
    bitpack.pack(_tree_cutting_glitch_in_logic);
    bitpack.pack(_damage_boosting_in_logic);
    bitpack.pack(_allow_whistle_usage_behind_trees);
    bitpack.pack(_ensure_ekeeke_in_shops);
    bitpack.pack_array(_items_distribution);
    bitpack.pack(_filler_item);
    bitpack.pack(_hints_distribution_region_requirement);
    bitpack.pack(_hints_distribution_item_requirement);
    bitpack.pack(_hints_distribution_item_location);
    bitpack.pack(_hints_distribution_dark_region);
    bitpack.pack(_hints_distribution_joke);
    bitpack.pack(_christmas_event);
    bitpack.pack(_secret_event);

    bitpack.pack_if(_enemies_damage_factor != 100, _enemies_damage_factor);
    bitpack.pack_if(_enemies_health_factor != 100, _enemies_health_factor);
    bitpack.pack_if(_enemies_armor_factor != 100, _enemies_armor_factor);
    bitpack.pack_if(_enemies_golds_factor != 100, _enemies_golds_factor);
    bitpack.pack_if(_enemies_drop_chance_factor != 100, _enemies_drop_chance_factor);
    bitpack.pack_if(_shop_prices_factor != 100, _shop_prices_factor);

    for(size_t i=0 ; i<_starting_items.size() ; ++i)
    {
        uint8_t item_id = (uint8_t)i;
        uint8_t quantity = _starting_items[i];
        if(quantity != 0)
        {
            bitpack.pack(true);
            bitpack.pack(item_id);
            bitpack.pack(quantity);
        }
    }
    bitpack.pack(false);

    bitpack.pack_vector(_possible_spawn_locations);
    bitpack.pack_vector(_finite_ground_items);
    bitpack.pack_vector(_finite_shop_items);

    bitpack.pack_vector_if(!_world_json.empty(), Json::to_msgpack(_world_json));
    bitpack.pack_vector_if(!_model_patch_items.empty(), Json::to_msgpack(_model_patch_items));
    bitpack.pack_vector_if(!_model_patch_spawns.empty(), Json::to_msgpack(_model_patch_spawns));
    bitpack.pack_vector_if(!_model_patch_hint_sources.empty(), Json::to_msgpack(_model_patch_hint_sources));

    return "l" + base64_encode(bitpack.bytes()) + "s";
}